

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O0

int soundfile_addtype(t_soundfile_type *type)

{
  char *__src;
  int i;
  t_soundfile_type *type_local;
  
  if (sf_numtypes == 4) {
    pd_error((void *)0x0,"soundfile: max number of type implementations reached");
    type_local._4_4_ = 0;
  }
  else {
    sf_types[sf_numtypes] = type;
    sf_numtypes = sf_numtypes + 1;
    if (sf_minheadersize < type->t_minheadersize) {
      sf_minheadersize = type->t_minheadersize;
    }
    __src = "-";
    if (1 < sf_numtypes) {
      __src = " -";
    }
    strcat(sf_typeargs,__src);
    strcat(sf_typeargs,type->t_name);
    type_local._4_4_ = 1;
  }
  return type_local._4_4_;
}

Assistant:

int soundfile_addtype(const t_soundfile_type *type)
{
    int i;
    if (sf_numtypes == SFMAXTYPES)
    {
        pd_error(0, "soundfile: max number of type implementations reached");
        return 0;
    }
    sf_types[sf_numtypes] = (t_soundfile_type *)type;
    sf_numtypes++;
    if (type->t_minheadersize > sf_minheadersize)
        sf_minheadersize = type->t_minheadersize;
    strcat(sf_typeargs, (sf_numtypes > 1 ? " -" : "-"));
    strcat(sf_typeargs, type->t_name);
    return 1;
}